

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O1

int __thiscall caldate_t::iso_weekno(caldate_t *this,int *year)

{
  int32_t iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  caldate_t this_thu;
  caldate_t jan1;
  caldate_t local_30;
  caldate_t local_24;
  
  uVar2 = (uint)((long)this->m < 3);
  iVar5 = this->y - uVar2;
  iVar3 = (this->y - uVar2) + 3;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  iVar6 = (int)((ulong)((long)iVar5 * -0x51eb851f) >> 0x20);
  iVar5 = (iVar5 + this->d + *(int *)(&DAT_002ca35c + (long)this->m * 4) + (iVar3 >> 2) +
           ((iVar6 >> 5) - (iVar6 >> 0x1f)) + iVar5 / 400) % 7;
  iVar1 = dayno(this);
  iVar3 = 6;
  if (iVar5 != 0) {
    iVar3 = iVar5 + -1;
  }
  iVar3 = (iVar1 - iVar3) + 3;
  set_dayno(&local_30,iVar3);
  if (year != (int *)0x0) {
    *year = local_30.y;
  }
  local_24.y = local_30.y;
  iVar5 = local_30.y + -1;
  iVar6 = local_30.y + 2;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  local_24.m = 1;
  local_24.d = 1;
  iVar4 = (int)((ulong)((long)iVar5 * -0x51eb851f) >> 0x20);
  iVar5 = (iVar6 >> 2) + local_30.y + ((iVar4 >> 5) - (iVar4 >> 0x1f)) + iVar5 / 400;
  iVar1 = dayno(&local_24);
  iVar5 = (iVar5 / 7) * 7 - iVar5;
  return (int)(iVar3 - (((iVar5 + 0xbU) / 7) * -7 + iVar5 + 0xb + iVar1)) / 7 + 1;
}

Assistant:

int iso_weekno(int *year) const
    {
        /* 
         *   Find the Thursday of the current ISO week.  To do this, figure
         *   our weekday, subtract the ISO weekday number minus 1 to get the
         *   nearest preceding Monday (the start of the ISO week), then add 3
         *   to get the following Thursday.  The year containing the Thursday
         *   of a given week is by definition the year which that whole week
         *   (starting on Monday) belongs to.
         */
        int wday = iso_weekday();
        int32_t this_thu_dayno = dayno() - (wday-1) + 3;
        caldate_t this_thu(this_thu_dayno);

        /* the year containing the Thursday is the week's calendar year */
        if (year != 0)
            *year = this_thu.y;

        /*
         *   Find the first Thursday of the calendar year we just calculated.
         *   ISO week 1 of a given calendar year is the week that contains
         *   the first Thursday of the year.  So find the first Thursday on
         *   or after Jan 1.
         */
        caldate_t jan1(this_thu.y, 1, 1);
        int jan1_wday = jan1.weekday();
        int32_t first_thu_dayno = jan1.dayno() + ((11 - jan1_wday) % 7);

        /*
         *   Calculate the number of weeks (== the number of days divided by
         *   seven) between the Thursday of the target week and the Thursday
         *   of the first week.  This gives us the difference in week
         *   numbers; since the first week is week #1, adding 1 to the
         *   difference gives us the target week number.
         */
        return ((this_thu_dayno - first_thu_dayno)/7) + 1;
    }